

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void __thiscall
CCoinsViewMemPool::PackageAddTransaction(CCoinsViewMemPool *this,CTransactionRef *tx)

{
  size_type sVar1;
  COutPoint *__args;
  long in_RDI;
  long in_FS_OFFSET;
  uint n;
  undefined4 in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  CTxOut *in_stack_ffffffffffffff10;
  COutPoint *in_stack_ffffffffffffff18;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *this_00;
  uint local_84;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_84 = 0;
  while( true ) {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    sVar1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (sVar1 <= local_84) break;
    __args = (COutPoint *)(in_RDI + 0x10);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    this_00 = (unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
               *)&stack0xffffffffffffffd4;
    COutPoint::COutPoint
              (in_stack_ffffffffffffff18,(Txid *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c
              );
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff18,
               (size_type)in_stack_ffffffffffffff10);
    Coin::Coin((Coin *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c
               ,SUB41((uint)in_stack_ffffffffffffff08 >> 0x18,0));
    std::
    unordered_map<COutPoint,Coin,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<std::pair<COutPoint_const,Coin>>>
    ::emplace<COutPoint,Coin>
              ((unordered_map<COutPoint,_Coin,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                *)this_00,__args,(Coin *)in_stack_ffffffffffffff18);
    Coin::~Coin((Coin *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffff18 = (COutPoint *)(in_RDI + 0x58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::
    unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>
    ::emplace<transaction_identifier<false>const&,unsigned_int&>
              (this_00,&__args->hash,(uint *)in_stack_ffffffffffffff18);
    local_84 = local_84 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewMemPool::PackageAddTransaction(const CTransactionRef& tx)
{
    for (unsigned int n = 0; n < tx->vout.size(); ++n) {
        m_temp_added.emplace(COutPoint(tx->GetHash(), n), Coin(tx->vout[n], MEMPOOL_HEIGHT, false));
        m_non_base_coins.emplace(tx->GetHash(), n);
    }
}